

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O0

void __thiscall Assimp::StreamWriter<false,_false>::Put<int>(StreamWriter<false,_false> *this,int f)

{
  size_t sVar1;
  size_type sVar2;
  int *piVar3;
  void *dest;
  StreamWriter<false,_false> *pSStack_10;
  int f_local;
  StreamWriter<false,_false> *this_local;
  
  dest._4_4_ = f;
  pSStack_10 = this;
  Intern::Getter<false,_int,_false>::operator()
            ((Getter<false,_int,_false> *)((long)&dest + 3),(int *)((long)&dest + 4),
             (bool)(this->le & 1));
  sVar1 = this->cursor;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer);
  if (sVar2 <= sVar1 + 4) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->buffer,this->cursor + 4);
  }
  piVar3 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&this->buffer,this->cursor);
  *piVar3 = dest._4_4_;
  this->cursor = this->cursor + 4;
  return;
}

Assistant:

void Put(T f)   {
        Intern :: Getter<SwapEndianess,T,RuntimeSwitch>() (&f, le);

        if (cursor + sizeof(T) >= buffer.size()) {
            buffer.resize(cursor + sizeof(T));
        }

        void* dest = &buffer[cursor];

        // reinterpret_cast + assignment breaks strict aliasing rules
        // and generally causes trouble on platforms such as ARM that
        // do not silently ignore alignment faults.
        ::memcpy(dest, &f, sizeof(T));
        cursor += sizeof(T);
    }